

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int loop_invariant_p(gen_ctx_t gen_ctx,loop_node_t_conflict loop,bb_insn_t_conflict bb_insn,
                    bitmap_t loop_invariant_insn_bitmap)

{
  int iVar1;
  ulong local_80;
  size_t i;
  insn_var_iterator_t iter;
  ssa_edge_t_conflict se;
  MIR_reg_t var;
  int op_num;
  loop_node_t_conflict curr_loop;
  bb_t_conflict bb;
  MIR_insn_t insn;
  bitmap_t loop_invariant_insn_bitmap_local;
  bb_insn_t_conflict bb_insn_local;
  loop_node_t_conflict loop_local;
  gen_ctx_t gen_ctx_local;
  
  bb = (bb_t_conflict)bb_insn->insn;
  curr_loop = (loop_node_t_conflict)bb_insn->bb;
  insn = (MIR_insn_t)loop_invariant_insn_bitmap;
  loop_invariant_insn_bitmap_local = (bitmap_t)bb_insn;
  bb_insn_local = (bb_insn_t_conflict)loop;
  loop_local = (loop_node_t_conflict)gen_ctx;
  iVar1 = MIR_any_branch_code_p((MIR_insn_code_t)bb->bfs);
  if ((((((((iVar1 == 0) && ((int)bb->bfs != 0xba)) && ((int)bb->bfs != 0xab)) &&
         (((int)bb->bfs != 0xac && ((int)bb->bfs != 0xb4)))) &&
        (iVar1 = MIR_call_code_p((MIR_insn_code_t)bb->bfs), iVar1 == 0)) &&
       ((((int)bb->bfs != 0xad && ((int)bb->bfs != 0xae)) &&
        (((int)bb->bfs != 0xaf &&
         ((((int)bb->bfs != 0xb2 && ((int)bb->bfs != 0xb0)) && ((int)bb->bfs != 0xb1)))))))) &&
      (((int)bb->bfs != 0xb3 && ((int)bb->bfs != 0x31)))) &&
     (((int)bb->bfs != 0x32 &&
      ((((int)bb->bfs != 0x33 && ((int)bb->bfs != 0x34)) &&
       (((int)bb->bfs != 0x38 &&
        ((((int)bb->bfs != 0x39 && ((int)bb->bfs != 0x3a)) && ((int)bb->bfs != 0x3b)))))))))) {
    for (local_80 = 0; local_80 < bb->bfs >> 0x20; local_80 = local_80 + 1) {
      if (((ulong)(&bb->bb_link)[local_80 * 3].next & 0xff) == 0xb) {
        return 0;
      }
      if ((((ulong)(&bb->bb_link)[local_80 * 3].next & 0xff) == 2) &&
         (iVar1 = bitmap_bit_p((const_bitmap_t)(loop_local->children_link).prev,
                               (ulong)*(uint *)&(&bb->in_edges)[local_80 * 3].head), iVar1 != 0)) {
        return 0;
      }
    }
    insn_var_iterator_init((insn_var_iterator_t *)&i,(MIR_insn_t)bb);
    do {
      do {
        iVar1 = input_insn_var_iterator_next
                          ((gen_ctx_t)loop_local,(insn_var_iterator_t *)&i,(MIR_reg_t *)&se,
                           (int *)((long)&se + 4));
        if (iVar1 == 0) {
          return 1;
        }
        iter.op_part_num = (size_t)(&bb->bb_link)[(long)se._4_4_ * 3].prev;
        if ((bb_t)iter.op_part_num == (bb_t)0x0) {
          __assert_fail("se != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x14bf,"int loop_invariant_p(gen_ctx_t, loop_node_t, bb_insn_t, bitmap_t)")
          ;
        }
        loop_invariant_insn_bitmap_local = (bitmap_t)((bb_t)iter.op_part_num)->pre;
      } while ((insn != (MIR_insn_t)0x0) &&
              (iVar1 = bitmap_bit_p((const_bitmap_t)insn,
                                    (ulong)*(uint *)((long)&loop_invariant_insn_bitmap_local->size +
                                                    4)), iVar1 != 0));
      curr_loop = (loop_node_t_conflict)loop_invariant_insn_bitmap_local[2].els_num;
      for (_var = bb_insn_local->gvn_val;
          (_var != 0 && (_var != *(long *)(*(long *)&curr_loop[1].max_int_pressure + 0x18)));
          _var = *(long *)(_var + 0x18)) {
      }
    } while (_var != 0);
  }
  return 0;
}

Assistant:

static int loop_invariant_p (gen_ctx_t gen_ctx, loop_node_t loop, bb_insn_t bb_insn,
                             bitmap_t loop_invariant_insn_bitmap) {
  MIR_insn_t insn = bb_insn->insn;
  bb_t bb = bb_insn->bb;
  loop_node_t curr_loop;
  int op_num;
  MIR_reg_t var;
  ssa_edge_t se;
  insn_var_iterator_t iter;

  if (MIR_any_branch_code_p (insn->code) || insn->code == MIR_PHI || insn->code == MIR_RET
      || insn->code == MIR_JRET || insn->code == MIR_LABEL || MIR_call_code_p (insn->code)
      || insn->code == MIR_ALLOCA || insn->code == MIR_BSTART || insn->code == MIR_BEND
      || insn->code == MIR_VA_START || insn->code == MIR_VA_ARG || insn->code == MIR_VA_BLOCK_ARG
      || insn->code == MIR_VA_END
      /* possible exception insns: */
      || insn->code == MIR_DIV || insn->code == MIR_DIVS || insn->code == MIR_UDIV
      || insn->code == MIR_UDIVS || insn->code == MIR_MOD || insn->code == MIR_MODS
      || insn->code == MIR_UMOD || insn->code == MIR_UMODS)
    return FALSE;
  for (size_t i = 0; i < insn->nops; i++) {
    if (insn->ops[i].mode == MIR_OP_VAR_MEM) return FALSE;
    if (insn->ops[i].mode == MIR_OP_VAR && bitmap_bit_p (tied_regs, insn->ops[i].u.var))
      return FALSE;
  }
  FOREACH_IN_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    se = insn->ops[op_num].data;
    gen_assert (se != NULL);
    bb_insn = se->def;
    if (loop_invariant_insn_bitmap != NULL
        && bitmap_bit_p (loop_invariant_insn_bitmap, bb_insn->index))
      continue;
    bb = bb_insn->bb;
    for (curr_loop = loop->parent; curr_loop != NULL; curr_loop = curr_loop->parent)
      if (curr_loop == bb->loop_node->parent) break;
    if (curr_loop == NULL) return FALSE;
  }
  return TRUE;
}